

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall pybind11::list::append<char_const(&)[2]>(list *this,char (*val) [2])

{
  PyObject *pPVar1;
  object local_10;
  
  pPVar1 = (this->super_object).super_handle.m_ptr;
  local_10.super_handle = detail::type_caster<char,_void>::cast(*val,copy,(handle)0x0);
  PyList_Append(pPVar1,local_10.super_handle.m_ptr);
  object::~object(&local_10);
  return;
}

Assistant:

void append(T &&val) const {
        PyList_Append(m_ptr, detail::object_or_cast(std::forward<T>(val)).ptr());
    }